

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

TanLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_tan(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x2d0) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x2d0;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    TanLayerParams::TanLayerParams(this_00.tan_);
    (this->layer_).tan_ = (TanLayerParams *)this_00;
  }
  return (TanLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::TanLayerParams* NeuralNetworkLayer::mutable_tan() {
  if (!has_tan()) {
    clear_layer();
    set_has_tan();
    layer_.tan_ = new ::CoreML::Specification::TanLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.tan)
  return layer_.tan_;
}